

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall cmGeneratorTarget::IsIPOEnabled(cmGeneratorTarget *this,string *lang,string *config)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmMakefile *pcVar3;
  bool bVar4;
  int iVar5;
  PolicyStatus PVar6;
  char *pcVar7;
  long *plVar8;
  cmake *pcVar9;
  ostream *poVar10;
  cmListFileBacktrace *pcVar11;
  size_type *psVar12;
  PolicyID id;
  char cVar13;
  ostringstream w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  cmListFileBacktrace local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar1 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"INTERPROCEDURAL_OPTIMIZATION","");
  pcVar7 = GetFeature(this,(string *)local_1a8,config);
  bVar4 = cmSystemTools::IsOn(pcVar7);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((bVar4) &&
     (((iVar5 = std::__cxx11::string::compare((char *)lang), iVar5 == 0 ||
       (iVar5 = std::__cxx11::string::compare((char *)lang), iVar5 == 0)) ||
      (iVar5 = std::__cxx11::string::compare((char *)lang), iVar5 == 0)))) {
    PVar6 = cmPolicies::PolicyMap::Get(&this->PolicyMap,CMP0069);
    pcVar3 = this->Makefile;
    if (WARN < PVar6) {
      std::operator+(&local_1e8,"_CMAKE_",lang);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_1e8);
      psVar12 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar12) {
        local_1a8._16_8_ = *psVar12;
        local_1a8._24_8_ = plVar8[3];
        local_1a8._0_8_ = pcVar1;
      }
      else {
        local_1a8._16_8_ = *psVar12;
        local_1a8._0_8_ = (size_type *)*plVar8;
      }
      local_1a8._8_8_ = plVar8[1];
      *plVar8 = (long)psVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      bVar4 = cmMakefile::IsOn(pcVar3,(string *)local_1a8);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if (bVar4) {
        pcVar3 = this->Makefile;
        std::operator+(&local_1e8,"_CMAKE_",lang);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_1e8);
        local_1a8._0_8_ = local_1a8 + 0x10;
        psVar12 = (size_type *)(plVar8 + 2);
        if ((size_type *)*plVar8 == psVar12) {
          local_1a8._16_8_ = *psVar12;
          local_1a8._24_8_ = plVar8[3];
        }
        else {
          local_1a8._16_8_ = *psVar12;
          local_1a8._0_8_ = (size_type *)*plVar8;
        }
        local_1a8._8_8_ = plVar8[1];
        *plVar8 = (long)psVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        bVar4 = cmMakefile::IsOn(pcVar3,(string *)local_1a8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if (bVar4) {
          iVar5 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x22])();
          pcVar7 = (char *)0x0;
          cVar13 = (char)iVar5;
          if (cVar13 == '\0') {
            pcVar7 = "CMake doesn\'t support IPO for current generator";
          }
        }
        else {
          pcVar7 = "Compiler doesn\'t support IPO";
          cVar13 = '\0';
        }
      }
      else {
        pcVar7 = "CMake doesn\'t support IPO for current compiler";
        cVar13 = '\0';
      }
      if (cVar13 != '\0') {
        return (bool)cVar13;
      }
      if (this->PolicyReportedCMP0069 != false) {
        return false;
      }
      this->PolicyReportedCMP0069 = true;
      pcVar9 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
      std::__cxx11::string::string((string *)local_1a8,pcVar7,(allocator *)&local_1c8);
      pcVar11 = cmTarget::GetBacktrace(this->Target);
      cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&local_1e8,pcVar11);
      cmake::IssueMessage(pcVar9,FATAL_ERROR,(string *)local_1a8,(cmListFileBacktrace *)&local_1e8);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_1e8);
      if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10) {
        return false;
      }
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      return false;
    }
    std::operator+(&local_1e8,"_CMAKE_",lang);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    psVar12 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar12) {
      local_1a8._16_8_ = *psVar12;
      local_1a8._24_8_ = plVar8[3];
      local_1a8._0_8_ = pcVar1;
    }
    else {
      local_1a8._16_8_ = *psVar12;
      local_1a8._0_8_ = (size_type *)*plVar8;
    }
    local_1a8._8_8_ = plVar8[1];
    *plVar8 = (long)psVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    bVar4 = cmMakefile::IsOn(pcVar3,(string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    paVar2 = &local_1e8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
      return true;
    }
    if (this->PolicyReportedCMP0069 == false) {
      pcVar9 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
      bVar4 = cmake::GetIsInTryCompile(pcVar9);
      if (PVar6 != WARN) {
        return false;
      }
      if (bVar4) {
        return false;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e8,(cmPolicies *)0x45,id);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,
                           local_1e8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "INTERPROCEDURAL_OPTIMIZATION property will be ignored for target ",0x41);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\'",1);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(this->Target->Name)._M_dataplus._M_p,
                           (this->Target->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\'.",2);
      pcVar9 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
      std::__cxx11::stringbuf::str();
      pcVar11 = cmTarget::GetBacktrace(this->Target);
      cmListFileBacktrace::cmListFileBacktrace(&local_1c8,pcVar11);
      cmake::IssueMessage(pcVar9,AUTHOR_WARNING,&local_1e8,&local_1c8);
      cmListFileBacktrace::~cmListFileBacktrace(&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      this->PolicyReportedCMP0069 = true;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
  }
  return false;
}

Assistant:

bool cmGeneratorTarget::IsIPOEnabled(std::string const& lang,
                                     std::string const& config) const
{
  const char* feature = "INTERPROCEDURAL_OPTIMIZATION";
  const bool result = cmSystemTools::IsOn(this->GetFeature(feature, config));

  if (!result) {
    // 'INTERPROCEDURAL_OPTIMIZATION' is off, no need to check policies
    return false;
  }

  if (lang != "C" && lang != "CXX" && lang != "Fortran") {
    // We do not define IPO behavior for other languages.
    return false;
  }

  cmPolicies::PolicyStatus cmp0069 = this->GetPolicyStatusCMP0069();

  if (cmp0069 == cmPolicies::OLD || cmp0069 == cmPolicies::WARN) {
    if (this->Makefile->IsOn("_CMAKE_" + lang + "_IPO_LEGACY_BEHAVIOR")) {
      return true;
    }
    if (this->PolicyReportedCMP0069) {
      // problem is already reported, no need to issue a message
      return false;
    }
    const bool in_try_compile =
      this->LocalGenerator->GetCMakeInstance()->GetIsInTryCompile();
    if (cmp0069 == cmPolicies::WARN && !in_try_compile) {
      std::ostringstream w;
      w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0069) << "\n";
      w << "INTERPROCEDURAL_OPTIMIZATION property will be ignored for target "
        << "'" << this->GetName() << "'.";
      this->LocalGenerator->GetCMakeInstance()->IssueMessage(
        cmake::AUTHOR_WARNING, w.str(), this->GetBacktrace());

      this->PolicyReportedCMP0069 = true;
    }
    return false;
  }

  // Note: check consistency with messages from CheckIPOSupported
  const char* message = CM_NULLPTR;
  if (!this->Makefile->IsOn("_CMAKE_" + lang + "_IPO_SUPPORTED_BY_CMAKE")) {
    message = "CMake doesn't support IPO for current compiler";
  } else if (!this->Makefile->IsOn("_CMAKE_" + lang +
                                   "_IPO_MAY_BE_SUPPORTED_BY_COMPILER")) {
    message = "Compiler doesn't support IPO";
  } else if (!this->GlobalGenerator->IsIPOSupported()) {
    message = "CMake doesn't support IPO for current generator";
  }

  if (!message) {
    // No error/warning messages
    return true;
  }

  if (this->PolicyReportedCMP0069) {
    // problem is already reported, no need to issue a message
    return false;
  }

  this->PolicyReportedCMP0069 = true;

  this->LocalGenerator->GetCMakeInstance()->IssueMessage(
    cmake::FATAL_ERROR, message, this->GetBacktrace());
  return false;
}